

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.c
# Opt level: O0

int console_askappend(LogPolicy *lp,Filename *filename,_func_void_void_ptr_int *callback,void *ctx)

{
  undefined1 local_10c [8];
  termios newmode;
  termios oldmode;
  termios cf;
  char line [32];
  void *ctx_local;
  _func_void_void_ptr_int *callback_local;
  Filename *filename_local;
  LogPolicy *lp_local;
  
  premsg((termios *)&oldmode.c_ispeed);
  if ((console_batch_mode & 1U) == 0) {
    fprintf(_stderr,
            "The session log file \"%.*s\" already exists.\nYou can overwrite it with a new session log,\nappend your session log to the end of it,\nor disable session logging for this session.\nEnter \"y\" to wipe the file, \"n\" to append to it,\nor just press Return to disable logging.\nWipe the log file? (y/n, Return cancels logging) "
            ,0x1000,filename->path);
    fflush(_stderr);
    tcgetattr(0,(termios *)&newmode.c_ispeed);
    memcpy(local_10c,&newmode.c_ispeed,0x3c);
    newmode.c_oflag = newmode.c_oflag | 0xb;
    tcsetattr(0,0,(termios *)local_10c);
    cf.c_ispeed._0_1_ = '\0';
    block_and_read(0,&cf.c_ispeed,0x1f);
    tcsetattr(0,0,(termios *)&newmode.c_ispeed);
    postmsg((termios *)&oldmode.c_ispeed);
    if (((char)cf.c_ispeed == 'y') || ((char)cf.c_ispeed == 'Y')) {
      lp_local._4_4_ = 2;
    }
    else if (((char)cf.c_ispeed == 'n') || ((char)cf.c_ispeed == 'N')) {
      lp_local._4_4_ = 1;
    }
    else {
      lp_local._4_4_ = 0;
    }
  }
  else {
    fprintf(_stderr,"The session log file \"%.*s\" already exists.\nLogging will not be enabled.\n",
            0x1000,filename->path);
    fflush(_stderr);
    lp_local._4_4_ = 0;
  }
  return lp_local._4_4_;
}

Assistant:

int console_askappend(LogPolicy *lp, Filename *filename,
                      void (*callback)(void *ctx, int result), void *ctx)
{
    static const char msgtemplate[] =
        "The session log file \"%.*s\" already exists.\n"
        "You can overwrite it with a new session log,\n"
        "append your session log to the end of it,\n"
        "or disable session logging for this session.\n"
        "Enter \"y\" to wipe the file, \"n\" to append to it,\n"
        "or just press Return to disable logging.\n"
        "Wipe the log file? (y/n, Return cancels logging) ";

    static const char msgtemplate_batch[] =
        "The session log file \"%.*s\" already exists.\n"
        "Logging will not be enabled.\n";

    char line[32];
    struct termios cf;

    premsg(&cf);
    if (console_batch_mode) {
        fprintf(stderr, msgtemplate_batch, FILENAME_MAX, filename->path);
        fflush(stderr);
        return 0;
    }
    fprintf(stderr, msgtemplate, FILENAME_MAX, filename->path);
    fflush(stderr);

    {
        struct termios oldmode, newmode;
        tcgetattr(0, &oldmode);
        newmode = oldmode;
        newmode.c_lflag |= ECHO | ISIG | ICANON;
        tcsetattr(0, TCSANOW, &newmode);
        line[0] = '\0';
        if (block_and_read(0, line, sizeof(line) - 1) <= 0)
            /* handled below */;
        tcsetattr(0, TCSANOW, &oldmode);
    }

    postmsg(&cf);
    if (line[0] == 'y' || line[0] == 'Y')
        return 2;
    else if (line[0] == 'n' || line[0] == 'N')
        return 1;
    else
        return 0;
}